

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharMap.h
# Opt level: O1

void __thiscall
UnifiedRegex::CharMap<char16_t,_int,_(UnifiedRegex::CharMapScheme)1>::Inner::Set
          (Inner *this,ArenaAllocator *allocator,int defv,int level,uint k,int v)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Node *pNVar4;
  long lVar5;
  undefined4 in_register_0000008c;
  ulong uVar6;
  uint uVar7;
  
  uVar6 = CONCAT44(in_register_0000008c,v);
  if (level < 1) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharMap.h"
                       ,0xb6,"(level > 0)","level > 0");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
    uVar6 = (ulong)(uint)v;
  }
  uVar7 = k >> ((byte)(level << 2) & 0x1f) & 0xf;
  if (this->children[uVar7] == (Node *)0x0) {
    if ((int)uVar6 == defv) {
      return;
    }
    if (level - 1U == 0) {
      pNVar4 = (Node *)new<Memory::ArenaAllocator>(0x48,allocator,0x366bee);
      pNVar4->_vptr_Node = (_func_int **)&PTR_FreeSelf_01559b90;
      lVar5 = 2;
      do {
        *(int *)((long)&pNVar4->_vptr_Node + lVar5 * 4) = defv;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 0x12);
    }
    else {
      pNVar4 = (Node *)new<Memory::ArenaAllocator>(0x88,allocator,0x366bee);
      pNVar4->_vptr_Node = (_func_int **)&PTR_FreeSelf_01559b50;
      pNVar4[1]._vptr_Node = (_func_int **)0x0;
      pNVar4[2]._vptr_Node = (_func_int **)0x0;
      pNVar4[3]._vptr_Node = (_func_int **)0x0;
      pNVar4[4]._vptr_Node = (_func_int **)0x0;
      pNVar4[5]._vptr_Node = (_func_int **)0x0;
      pNVar4[6]._vptr_Node = (_func_int **)0x0;
      pNVar4[7]._vptr_Node = (_func_int **)0x0;
      pNVar4[8]._vptr_Node = (_func_int **)0x0;
      pNVar4[9]._vptr_Node = (_func_int **)0x0;
      pNVar4[10]._vptr_Node = (_func_int **)0x0;
      pNVar4[0xb]._vptr_Node = (_func_int **)0x0;
      pNVar4[0xc]._vptr_Node = (_func_int **)0x0;
      pNVar4[0xd]._vptr_Node = (_func_int **)0x0;
      pNVar4[0xe]._vptr_Node = (_func_int **)0x0;
      pNVar4[0xf]._vptr_Node = (_func_int **)0x0;
      pNVar4[0x10]._vptr_Node = (_func_int **)0x0;
    }
    uVar6 = uVar6 & 0xffffffff;
    this->children[uVar7] = pNVar4;
  }
  (*this->children[uVar7]->_vptr_Node[1])
            (this->children[uVar7],allocator,(ulong)(uint)defv,(ulong)(level - 1U),(ulong)k,uVar6);
  return;
}

Assistant:

void Set(ArenaAllocator* allocator, V defv, int level, uint k, V v) override
            {
                Assert(level > 0);
                uint i = innerIdx(level--, k);
                if (children[i] == 0)
                {
                    if (v == defv)
                        return;
                    children[i] = Node::For(allocator, level, defv);
                }
                children[i]->Set(allocator, defv, level, k, v);
            }